

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

SelectionFlags __thiscall
QAbstractItemViewPrivate::multiSelectionCommand
          (QAbstractItemViewPrivate *this,QModelIndex *index,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  MouseButton MVar4;
  Int IVar5;
  QEvent *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff98;
  QFlagsStorage<QItemSelectionModel::SelectionFlag> in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_10;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX == (QEvent *)0x0) {
    selectionBehaviorFlags
              ((QAbstractItemViewPrivate *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         ::operator|(NoUpdate,(QFlags<QItemSelectionModel::SelectionFlag>)
                              in_stack_ffffffffffffff9c.i);
  }
  else {
    TVar2 = QEvent::type(in_RDX);
    switch(TVar2) {
    case MouseButtonPress:
      MVar4 = QSinglePointEvent::button((QSinglePointEvent *)in_RDX);
      if ((MVar4 == LeftButton) &&
         ((((*(byte *)(in_RDI + 0x3a4) & 1) == 0 || ((*(byte *)(in_RDI + 0x3dc) & 1) == 0)) ||
          (bVar1 = isIndexDragEnabled((QAbstractItemViewPrivate *)
                                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                      (QModelIndex *)
                                      CONCAT44(in_stack_ffffffffffffff9c.i,in_stack_ffffffffffffff98
                                              )), !bVar1)))) {
        selectionBehaviorFlags
                  ((QAbstractItemViewPrivate *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
             ::operator|(NoUpdate,(QFlags<QItemSelectionModel::SelectionFlag>)
                                  in_stack_ffffffffffffff9c.i);
        goto LAB_0081097f;
      }
      break;
    case MouseButtonRelease:
      MVar4 = QSinglePointEvent::button((QSinglePointEvent *)in_RDX);
      if (MVar4 == LeftButton) {
        if (((((*(byte *)(in_RDI + 0x3a4) & 1) == 0) || ((*(byte *)(in_RDI + 0x3dc) & 1) == 0)) ||
            (bVar1 = isIndexDragEnabled((QAbstractItemViewPrivate *)
                                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0
                                                ),
                                        (QModelIndex *)
                                        CONCAT44(in_stack_ffffffffffffff9c.i,
                                                 in_stack_ffffffffffffff98)), !bVar1)) ||
           (bVar1 = ::operator==((QModelIndex *)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 (QPersistentModelIndex *)
                                 CONCAT44(in_stack_ffffffffffffff9c.i,in_stack_ffffffffffffff98)),
           !bVar1)) {
          selectionBehaviorFlags
                    ((QAbstractItemViewPrivate *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
               (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
               ::operator|(NoUpdate,(QFlags<QItemSelectionModel::SelectionFlag>)
                                    in_stack_ffffffffffffff9c.i);
        }
        else {
          selectionBehaviorFlags
                    ((QAbstractItemViewPrivate *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
               (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
               ::operator|(NoUpdate,(QFlags<QItemSelectionModel::SelectionFlag>)
                                    in_stack_ffffffffffffff9c.i);
        }
        goto LAB_0081097f;
      }
      break;
    default:
      break;
    case MouseMove:
      QSinglePointEvent::buttons
                ((QSinglePointEvent *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))
      ;
      local_10.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QFlags<Qt::MouseButton>::operator&
                     ((QFlags<Qt::MouseButton> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c.i);
      IVar5 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
      if (IVar5 != 0) {
        selectionBehaviorFlags
                  ((QAbstractItemViewPrivate *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
             ::operator|(NoUpdate,(QFlags<QItemSelectionModel::SelectionFlag>)
                                  in_stack_ffffffffffffff9c.i);
        goto LAB_0081097f;
      }
      break;
    case KeyPress:
      iVar3 = QKeyEvent::key((QKeyEvent *)in_RDX);
      if ((iVar3 == 0x20) || (iVar3 = QKeyEvent::key((QKeyEvent *)in_RDX), iVar3 == 0x1010000)) {
        selectionBehaviorFlags
                  ((QAbstractItemViewPrivate *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
             ::operator|(NoUpdate,(QFlags<QItemSelectionModel::SelectionFlag>)
                                  in_stack_ffffffffffffff9c.i);
        goto LAB_0081097f;
      }
    }
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c.i);
  }
LAB_0081097f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
           (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
           local_c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i;
  }
  __stack_chk_fail();
}

Assistant:

QItemSelectionModel::SelectionFlags QAbstractItemViewPrivate::multiSelectionCommand(
    const QModelIndex &index, const QEvent *event) const
{
    Q_UNUSED(index);

    if (event) {
        switch (event->type()) {
        case QEvent::KeyPress:
            if (static_cast<const QKeyEvent*>(event)->key() == Qt::Key_Space
             || static_cast<const QKeyEvent*>(event)->key() == Qt::Key_Select)
                return QItemSelectionModel::Toggle|selectionBehaviorFlags();
            break;
        case QEvent::MouseButtonPress:
            if (static_cast<const QMouseEvent*>(event)->button() == Qt::LeftButton) {
                // since the press might start a drag, deselect only on release
                if (!pressedAlreadySelected
#if QT_CONFIG(draganddrop)
                        || !dragEnabled || !isIndexDragEnabled(index)
#endif
                        )
                    return QItemSelectionModel::Toggle|selectionBehaviorFlags(); // toggle
            }
            break;
        case QEvent::MouseButtonRelease:
            if (static_cast<const QMouseEvent*>(event)->button() == Qt::LeftButton) {
                if (pressedAlreadySelected
#if QT_CONFIG(draganddrop)
                        && dragEnabled && isIndexDragEnabled(index)
#endif
                        && index == pressedIndex)
                    return QItemSelectionModel::Toggle|selectionBehaviorFlags();
                return QItemSelectionModel::NoUpdate|selectionBehaviorFlags(); // finalize
            }
            break;
        case QEvent::MouseMove:
            if (static_cast<const QMouseEvent*>(event)->buttons() & Qt::LeftButton)
                return QItemSelectionModel::ToggleCurrent|selectionBehaviorFlags(); // toggle drag select
            break;
        default:
            break;
        }
        return QItemSelectionModel::NoUpdate;
    }

    return QItemSelectionModel::Toggle|selectionBehaviorFlags();
}